

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateElementDampingEnergy
          (ChElementBeamTaperedTimoshenko *this,ChVector<double> *DampingEnergyV_trans,
          ChVector<double> *DampingEnergyV_rot)

{
  int iVar1;
  char *__function;
  undefined1 auVar2 [64];
  ChVectorDynamic<> displ_dt;
  ChVectorDynamic<> displ;
  ChVectorN<double,_6> damping_energy_v;
  ChVectorN<double,_12> damping_energy;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1a0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_190;
  undefined1 local_178 [32];
  scalar_constant_op<double> local_158;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_150;
  undefined8 local_148;
  ChMatrixDynamic<> *local_140;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_138;
  Scalar local_130;
  undefined1 auStack_128 [40];
  Matrix<double,_12,_1,_0,_12,_1> aMStack_100 [2];
  
  iVar1 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])();
  local_190.m_storage.m_data = (double *)0x0;
  local_190.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_190,(long)iVar1);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_190);
  iVar1 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  local_1a0.m_storage.m_data = (double *)0x0;
  local_1a0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1a0,(long)iVar1);
  GetField_dt(this,(ChVectorDynamic<> *)&local_1a0);
  if (local_190.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_190.m_storage.m_rows ==
      (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows)
  {
    local_140 = &this->Rm;
    local_178._16_8_ = local_190.m_storage.m_rows;
    local_158.m_other = 0.5;
    local_150 = &local_190;
    local_138 = &local_1a0;
    if ((this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        == local_1a0.m_storage.m_rows) {
      if (local_190.m_storage.m_rows == 0xc) {
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[8] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[9] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[10] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[0xb] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[0] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[1] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[2] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[3] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[4] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[5] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[6] = 0.0;
        aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
        m_data.array[7] = 0.0;
        local_130 = 1.0;
        Eigen::internal::
        generic_product_impl<Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>,Eigen::Matrix<double,-1,-1,1,-1,-1>,1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
        ::scaleAndAddTo<Eigen::Matrix<double,12,1,0,12,1>>
                  (aMStack_100,
                   (Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>
                    *)local_178,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1a0,&local_130);
        local_178._8_8_ = 3;
        local_158.m_other = 0.0;
        local_148 = 6;
        auVar2._8_8_ = aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                       .m_storage.m_data.array[1];
        auVar2._0_8_ = aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                       .m_storage.m_data.array[0];
        auVar2._16_8_ =
             aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
             .m_data.array[2];
        auVar2._24_8_ =
             aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
             .m_data.array[3];
        auVar2._32_8_ =
             aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
             .m_data.array[4];
        auVar2._40_8_ =
             aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
             .m_data.array[5];
        auVar2._48_8_ =
             aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
             .m_data.array[6];
        auVar2._56_8_ =
             aMStack_100[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
             .m_data.array[7];
        auVar2 = vaddpd_avx512f(ZEXT4864(CONCAT840(aMStack_100[0].
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                                  .m_storage.m_data.array[0xb],
                                                  CONCAT832(aMStack_100[0].
                                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                                  .m_storage.m_data.array[10],
                                                  CONCAT824(aMStack_100[0].
                                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                                  .m_storage.m_data.array[9],
                                                  CONCAT816(aMStack_100[0].
                                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                                  .m_storage.m_data.array[8],
                                                  CONCAT88(aMStack_100[0].
                                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                                  .m_storage.m_data.array[7],
                                                  aMStack_100[0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                                  .m_storage.m_data.array[6])))))),auVar2);
        local_130 = auVar2._0_8_;
        auStack_128 = auVar2._8_40_;
        local_178._0_8_ = &local_130;
        local_178._24_8_ = &local_130;
        ChVector<double>::operator=
                  (DampingEnergyV_trans,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   local_178);
        local_178._0_8_ = auStack_128 + 0x10;
        local_178._8_8_ = 3;
        local_158.m_other = 1.48219693752374e-323;
        local_148 = 6;
        local_178._24_8_ = &local_130;
        ChVector<double>::operator=
                  (DampingEnergyV_rot,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   local_178);
        if (local_1a0.m_storage.m_data != (double *)0x0) {
          free((void *)local_1a0.m_storage.m_data[-1]);
        }
        if (local_190.m_storage.m_data != (double *)0x0) {
          free((void *)local_190.m_storage.m_data[-1]);
        }
        return;
      }
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 12, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 12, 1>]"
                   );
    }
    __function = 
    "Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, _Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 1]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateElementDampingEnergy(ChVector<>& DampingEnergyV_trans,
                                                                  ChVector<>& DampingEnergyV_rot) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    ChVectorDynamic<> displ_dt(this->GetNdofs());
    this->GetField_dt(displ_dt);

    ChVectorN<double, 12> damping_energy = 1.0 / 2.0 * displ.asDiagonal() * this->Rm * displ_dt;
    ChVectorN<double, 6> damping_energy_v;
    // double damping_energy_sum = 0;
    for (int i = 0; i < 6; i++) {
        damping_energy_v(i) = damping_energy(i) + damping_energy(i + 6);
        // damping_energy_sum += damping_energy_v(i);
    }

    DampingEnergyV_trans = damping_energy_v.segment(0, 3);
    DampingEnergyV_rot = damping_energy_v.segment(3, 3);
}